

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_recursive_cte_node.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundRecursiveCTENode *node)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  shared_ptr<duckdb::Binder,_true> *this_01;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> uVar2;
  templated_unique_single_t tVar3;
  __node_base this_02;
  Binder *pBVar4;
  pointer pBVar5;
  mapped_type *pmVar6;
  type puVar7;
  pointer pLVar8;
  LogicalSetOperation *this_03;
  InvalidInputException *this_04;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var9;
  pointer *__ptr;
  BoundQueryNode *node_00;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> node_01;
  undefined1 uVar10;
  bool bVar11;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> right_node
  ;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> left_node;
  templated_unique_single_t root;
  undefined1 local_98 [16];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  _Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false> local_80;
  LogicalSetOperation *local_78;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_70;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  __node_base local_58;
  undefined1 local_50 [32];
  
  bVar11 = *(bool *)((long)&node[2].left.
                            super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
                            .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl + 1
                    );
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x16);
  local_60._M_head_impl = (LogicalOperator *)this;
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  pBVar4->is_outside_flattened = bVar11;
  bVar11 = *(bool *)((long)&node[2].left.
                            super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
                            .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl + 1
                    );
  this_01 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x18);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  pBVar4->is_outside_flattened = bVar11;
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0x10));
  CreatePlan((Binder *)&left_node,(BoundQueryNode *)pBVar4);
  local_58._M_nxt = (_Hash_node_base *)this_01;
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0x11));
  CreatePlan((Binder *)&right_node,(BoundQueryNode *)pBVar4);
  uVar10 = 1;
  if ((*(char *)&node[2].left.
                 super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
                 .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl == '\0') &&
     (pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00),
     pBVar4->has_unplanned_dependent_joins == false)) {
    pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_58._M_nxt);
    uVar10 = pBVar4->has_unplanned_dependent_joins;
  }
  *(undefined1 *)
   &node[2].left.
    super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
    super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = uVar10;
  pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)(in_RDX + 0x10));
  local_68._M_head_impl =
       (LogicalOperator *)
       left_node.
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  left_node.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  CastLogicalOperatorToTypes
            ((Binder *)&root,(vector<duckdb::LogicalType,_true> *)node,&pBVar5->types,in_RDX + 8);
  this_02._M_nxt = local_58._M_nxt;
  tVar3 = root;
  uVar2 = left_node;
  root.
  super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>)
       (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
        )0x0;
  left_node.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       tVar3.
       super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
       .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl;
  if (uVar2.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)uVar2.
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 8)
    )();
  }
  root.
  super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>)
       (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
        )0x0;
  if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
      local_68._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_68._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_68._M_head_impl = (LogicalOperator *)0x0;
  pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)(in_RDX + 0x11));
  local_70._M_head_impl =
       (LogicalOperator *)
       right_node.
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  right_node.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  CastLogicalOperatorToTypes
            ((Binder *)&root,(vector<duckdb::LogicalType,_true> *)node,&pBVar5->types,in_RDX + 8);
  tVar3 = root;
  uVar2 = right_node;
  root.
  super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>)
       (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
        )0x0;
  right_node.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       tVar3.
       super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
       .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl;
  if (uVar2.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)uVar2.
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 8)
    )();
  }
  root.
  super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>)
       (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
        )0x0;
  if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
      local_70._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_70._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_70._M_head_impl = (LogicalOperator *)0x0;
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
  node_00 = (BoundQueryNode *)(in_RDX + 0xb);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root,
                   "recurring.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node_00);
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pBVar4->bind_context,(key_type *)&root);
  if ((pmVar6->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar11 = false;
  }
  else {
    pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "recurring.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node_00);
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pBVar4->bind_context,(key_type *)local_50);
    puVar7 = shared_ptr<unsigned_long,_true>::operator*(pmVar6);
    bVar11 = *puVar7 != 0;
    if ((_Hash_node_base *)local_50._0_8_ != (_Hash_node_base *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  if (root.
      super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl !=
      (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>)
      local_98) {
    operator_delete((void *)root.
                            super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                            .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>.
                            _M_head_impl);
  }
  if ((in_RDX[0x12].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
       in_RDX[0x13].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl & bVar11) == 1) {
    this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    root.
    super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
    .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
         )(unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
           )local_98;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&root,"RECURRING can only be used with USING KEY in recursive CTE.","");
    InvalidInputException::InvalidInputException(this_04,(string *)&root);
    __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pBVar4->bind_context,(key_type *)node_00);
  if ((pmVar6->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (bVar11 == false) goto LAB_0178e415;
  }
  else {
    pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pBVar4->bind_context,(key_type *)node_00);
    puVar7 = shared_ptr<unsigned_long,_true>::operator*(pmVar6);
    if (*puVar7 == 0 && bVar11 == false) {
LAB_0178e415:
      _Var9._M_head_impl =
           in_RDX[8].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      _Var1._M_head_impl =
           in_RDX[9].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      this_03 = (LogicalSetOperation *)operator_new(0x80);
      node_01._M_head_impl =
           in_RDX[0x15].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      root.
      super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
            )(unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
              )left_node.
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      left_node.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      local_88._M_head_impl =
           (LogicalOperator *)
           right_node.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      right_node.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      LogicalSetOperation::LogicalSetOperation
                (this_03,(idx_t)node_01._M_head_impl,
                 ((long)_Var1._M_head_impl - (long)_Var9._M_head_impl >> 3) * -0x5555555555555555,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&root,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_88,LOGICAL_UNION,true,true);
      _Var9._M_head_impl = local_60._M_head_impl;
      if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_88._M_head_impl !=
          (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(local_88._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_88._M_head_impl = (LogicalOperator *)0x0;
      if (root.
          super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
          .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)root.
                              super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                              .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>.
                              _M_head_impl + 8))();
      }
      local_78 = this_03;
      VisitQueryNode((Binder *)_Var9._M_head_impl,(BoundQueryNode *)node_01._M_head_impl,in_RDX);
      if (local_78 != (LogicalSetOperation *)0x0) {
        (*(local_78->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      local_78 = (LogicalSetOperation *)0x0;
      goto LAB_0178e4dd;
    }
  }
  local_88._M_head_impl =
       (LogicalOperator *)
       (((long)in_RDX[9].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
         (long)in_RDX[8].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl >> 3) *
       -0x5555555555555555);
  make_uniq<duckdb::LogicalRecursiveCTE,std::__cxx11::string&,unsigned_long&,unsigned_long,bool&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((duckdb *)&root,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node_00,
             (unsigned_long *)(in_RDX + 0x15),(unsigned_long *)&local_88,(bool *)(in_RDX + 0xf),
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)(in_RDX + 0x12),&left_node,&right_node);
  pLVar8 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->(&root);
  _Var9._M_head_impl = local_60._M_head_impl;
  local_80._M_head_impl = (LogicalRecursiveCTE *)root;
  (pLVar8->super_LogicalOperator).field_0x62 = bVar11;
  root.
  super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>)
       (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
        )0x0;
  VisitQueryNode((Binder *)local_60._M_head_impl,node_00,in_RDX);
  if ((_Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>)local_80._M_head_impl !=
      (_Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>)0x0) {
    (*((local_80._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
  }
  local_80._M_head_impl = (LogicalRecursiveCTE *)0x0;
  if (root.
      super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
      .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)root.
                          super_unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
                          .super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl
                + 8))();
  }
LAB_0178e4dd:
  if (right_node.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)right_node.
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 8)
    )();
  }
  if (left_node.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)left_node.
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 8)
    )();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         _Var9._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundRecursiveCTENode &node) {
	// Generate the logical plan for the left and right sides of the set operation
	node.left_binder->is_outside_flattened = is_outside_flattened;
	node.right_binder->is_outside_flattened = is_outside_flattened;

	auto left_node = node.left_binder->CreatePlan(*node.left);
	auto right_node = node.right_binder->CreatePlan(*node.right);

	// check if there are any unplanned subqueries left in either child
	has_unplanned_dependent_joins = has_unplanned_dependent_joins || node.left_binder->has_unplanned_dependent_joins ||
	                                node.right_binder->has_unplanned_dependent_joins;

	// for both the left and right sides, cast them to the same types
	left_node = CastLogicalOperatorToTypes(node.left->types, node.types, std::move(left_node));
	right_node = CastLogicalOperatorToTypes(node.right->types, node.types, std::move(right_node));

	bool ref_recurring = node.right_binder->bind_context.cte_references["recurring." + node.ctename] &&
	                     *node.right_binder->bind_context.cte_references["recurring." + node.ctename] != 0;

	if (node.key_targets.empty() && ref_recurring) {
		throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
	}

	// Check if there is a reference to the recursive or recurring table, if not create a set operator.
	if ((!node.right_binder->bind_context.cte_references[node.ctename] ||
	     *node.right_binder->bind_context.cte_references[node.ctename] == 0) &&
	    !ref_recurring) {
		auto root = make_uniq<LogicalSetOperation>(node.setop_index, node.types.size(), std::move(left_node),
		                                           std::move(right_node), LogicalOperatorType::LOGICAL_UNION, true);
		return VisitQueryNode(node, std::move(root));
	}

	auto root =
	    make_uniq<LogicalRecursiveCTE>(node.ctename, node.setop_index, node.types.size(), node.union_all,
	                                   std::move(node.key_targets), std::move(left_node), std::move(right_node));
	root->ref_recurring = ref_recurring;
	return VisitQueryNode(node, std::move(root));
}